

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

Logger * google::base::GetLogger(LogSeverity severity)

{
  LogDestination *this;
  Logger *pLVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  LogSeverity severity_local;
  
  l._M_device._4_4_ = severity;
  std::lock_guard<std::mutex>::lock_guard(&local_18,(mutex_type *)log_mutex);
  this = LogDestination::log_destination(l._M_device._4_4_);
  pLVar1 = LogDestination::GetLoggerImpl(this);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return pLVar1;
}

Assistant:

base::Logger* base::GetLogger(LogSeverity severity) {
  std::lock_guard<std::mutex> l{log_mutex};
  return LogDestination::log_destination(severity)->GetLoggerImpl();
}